

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O0

bool __thiscall
google::protobuf::Reflection::HasField(Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  Label LVar2;
  Descriptor *pDVar3;
  OneofDescriptor *pOVar4;
  FieldDescriptor *in_RDX;
  Message *in_RSI;
  Reflection *in_RDI;
  int in_stack_00000034;
  ExtensionSet *in_stack_00000038;
  char *in_stack_00000058;
  char *in_stack_00000060;
  FieldDescriptor *in_stack_00000068;
  Descriptor *in_stack_00000070;
  FieldDescriptor *in_stack_00000090;
  Message *in_stack_00000098;
  Reflection *in_stack_000000a0;
  Message *in_stack_ffffffffffffffc8;
  Reflection *in_stack_ffffffffffffffd0;
  Reflection *this_00;
  bool local_1;
  
  this_00 = in_RDI;
  pDVar3 = FieldDescriptor::containing_type(in_RDX);
  if (pDVar3 != in_RDI->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058);
  }
  LVar2 = FieldDescriptor::label(in_RDX);
  if (LVar2 == LABEL_REPEATED) {
    anon_unknown_0::ReportReflectionUsageError
              (in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_00000058);
  }
  bVar1 = FieldDescriptor::is_extension(in_RDX);
  if (bVar1) {
    GetExtensionSet(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    FieldDescriptor::number(in_RDX);
    local_1 = internal::ExtensionSet::Has(in_stack_00000038,in_stack_00000034);
  }
  else {
    pOVar4 = FieldDescriptor::containing_oneof(in_RDX);
    if (pOVar4 == (OneofDescriptor *)0x0) {
      local_1 = HasBit(in_stack_000000a0,in_stack_00000098,in_stack_00000090);
    }
    else {
      local_1 = HasOneofField(this_00,in_RSI,in_RDX);
    }
  }
  return local_1;
}

Assistant:

bool Reflection::HasField(const Message& message,
                          const FieldDescriptor* field) const {
  USAGE_CHECK_MESSAGE_TYPE(HasField);
  USAGE_CHECK_SINGULAR(HasField);

  if (field->is_extension()) {
    return GetExtensionSet(message).Has(field->number());
  } else {
    if (field->containing_oneof()) {
      return HasOneofField(message, field);
    } else {
      return HasBit(message, field);
    }
  }
}